

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O0

void __thiscall WasmCGen::If(WasmCGen *this)

{
  undefined8 uVar1;
  string local_30;
  WasmCGen *local_10;
  WasmCGen *this_local;
  
  local_10 = this;
  printf("/*%s*/\n","If");
  w3SourceGen::pop_abi_cxx11_(&local_30,&this->super_w3SourceGen);
  uVar1 = std::__cxx11::string::c_str();
  printf("if (%s) {\n",uVar1);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

CGEN (If)
{
    printf ("/*%s*/\n", __func__);
    printf ("if (%s) {\n", pop().c_str());
}